

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O0

int __thiscall btMultiBodyPoint2Point::getIslandIdA(btMultiBodyPoint2Point *this)

{
  int iVar1;
  int iVar2;
  btCollisionObject *this_00;
  btMultibodyLink *pbVar3;
  long in_RDI;
  int i;
  btMultiBodyLinkCollider *col;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int local_1c;
  int local_4;
  
  if (*(long *)(in_RDI + 0x60) == 0) {
    if (*(long *)(in_RDI + 8) != 0) {
      this_00 = (btCollisionObject *)btMultiBody::getBaseCollider(*(btMultiBody **)(in_RDI + 8));
      if (this_00 != (btCollisionObject *)0x0) {
        iVar1 = btCollisionObject::getIslandTag(this_00);
        return iVar1;
      }
      local_1c = 0;
      while (iVar1 = local_1c, iVar2 = btMultiBody::getNumLinks((btMultiBody *)0x255bed),
            iVar1 < iVar2) {
        pbVar3 = btMultiBody::getLink
                           ((btMultiBody *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc);
        if (pbVar3->m_collider != (btMultiBodyLinkCollider *)0x0) {
          pbVar3 = btMultiBody::getLink
                             ((btMultiBody *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
          iVar1 = btCollisionObject::getIslandTag((btCollisionObject *)pbVar3->m_collider);
          return iVar1;
        }
        local_1c = local_1c + 1;
      }
    }
    local_4 = -1;
  }
  else {
    local_4 = btCollisionObject::getIslandTag(*(btCollisionObject **)(in_RDI + 0x60));
  }
  return local_4;
}

Assistant:

int btMultiBodyPoint2Point::getIslandIdA() const
{
	if (m_rigidBodyA)
		return m_rigidBodyA->getIslandTag();

	if (m_bodyA)
	{
		btMultiBodyLinkCollider* col = m_bodyA->getBaseCollider();
		if (col)
			return col->getIslandTag();
		for (int i=0;i<m_bodyA->getNumLinks();i++)
		{
			if (m_bodyA->getLink(i).m_collider)
				return m_bodyA->getLink(i).m_collider->getIslandTag();
		}
	}
	return -1;
}